

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

time util::to_local_time(time t)

{
  time_t tVar1;
  tm datetime;
  time in_stack_ffffffffffffffd0;
  
  format_time(in_stack_ffffffffffffffd0);
  tVar1 = mktime((tm *)&stack0xffffffffffffffc0);
  return tVar1;
}

Assistant:

time to_local_time(time t) {
	
	// Format time as UTC ...
	std::tm datetime = format_time(t);
	
	// ... and interpret it as local time
	datetime.tm_isdst = 0;
	#if defined(_WIN32)
	return _mktime64(&datetime);
	#else
	return std::mktime(&datetime);
	#endif
}